

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O0

block_t * __thiscall
plot::detail::braille::block_t::over(block_t *__return_storage_ptr__,block_t *this,block_t *other)

{
  float fVar1;
  Color CVar2;
  block_t *local_f0;
  block_t *local_e8;
  float local_b4;
  Color local_b0;
  float local_a0;
  Color local_9c;
  float local_8c;
  Color local_88;
  Color local_78;
  undefined8 uStack_68;
  Color mixed_color;
  Color over_color;
  Color new_color;
  undefined1 local_30 [8];
  Color old_color;
  float total;
  uint8_t over_;
  uint8_t over_pixels;
  uint8_t new_;
  uint8_t old;
  block_t *other_local;
  block_t *this_local;
  
  old_color.a._3_1_ = bitcount(other->pixels & (this->pixels ^ 0xff));
  old_color.a._2_1_ = bitcount(this->pixels & (other->pixels ^ 0xff));
  old_color.a._1_1_ = other->pixels & this->pixels;
  old_color.a._0_1_ = bitcount(old_color.a._1_1_);
  old_color.b = (float)((uint)old_color.a._3_1_ + (uint)old_color.a._2_1_ + (uint)old_color.a._0_1_)
  ;
  fVar1 = (other->color).a;
  local_e8 = other;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    local_e8 = this;
  }
  local_30._0_4_ = (local_e8->color).r;
  local_30._4_4_ = (local_e8->color).g;
  old_color.r = (local_e8->color).b;
  old_color.g = (local_e8->color).a;
  fVar1 = (this->color).a;
  local_f0 = this;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    local_f0 = other;
  }
  over_color.b = (local_f0->color).r;
  over_color.a = (local_f0->color).g;
  CVar2 = Color::over((Color *)&over_color.b,(Color *)local_30);
  over_color._0_8_ = CVar2._8_8_;
  mixed_color._8_8_ = CVar2._0_8_;
  local_8c = (float)old_color.a._3_1_ / old_color.b;
  CVar2 = operator*(&local_8c,(Color *)local_30);
  local_88._8_8_ = CVar2._8_8_;
  local_88._0_8_ = CVar2._0_8_;
  local_a0 = (float)old_color.a._2_1_ / old_color.b;
  CVar2 = operator*(&local_a0,(Color *)&over_color.b);
  local_9c._8_8_ = CVar2._8_8_;
  local_9c._0_8_ = CVar2._0_8_;
  CVar2 = operator+(&local_88,&local_9c);
  local_78._8_8_ = CVar2._8_8_;
  local_78._0_8_ = CVar2._0_8_;
  local_b4 = (float)old_color.a._0_1_ / old_color.b;
  CVar2 = operator*(&local_b4,(Color *)&mixed_color.b);
  local_b0._8_8_ = CVar2._8_8_;
  local_b0._0_8_ = CVar2._0_8_;
  CVar2 = operator+(&local_78,&local_b0);
  mixed_color._0_8_ = CVar2._8_8_;
  uStack_68 = CVar2._0_8_;
  block_t(__return_storage_ptr__,CVar2,
          (byte)*(undefined4 *)&this->pixels | (byte)*(undefined4 *)&other->pixels);
  return __return_storage_ptr__;
}

Assistant:

block_t over(block_t const& other) const {
            auto old = bitcount(other.pixels & ~pixels);
            auto new_ = bitcount(pixels & ~other.pixels);

            std::uint8_t over_pixels = other.pixels & pixels;
            auto over_ = bitcount(over_pixels);

            float total = old + new_ + over_;

            auto old_color = (other.color.a != 0.0f) ? other.color : color;
            auto new_color = (color.a != 0.0f) ? color : other.color;
            auto over_color = new_color.over(old_color);

            auto mixed_color = (old/total)*old_color + (new_/total)*new_color + (over_/total)*over_color;

            return { mixed_color, std::uint8_t(pixels | other.pixels) };
        }